

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootindexproxymodel.cpp
# Opt level: O1

void __thiscall
RootIndexProxyModelPrivate::onColumnsMoved
          (RootIndexProxyModelPrivate *this,QModelIndex *sourceParent,int sourceStart,int sourceEnd,
          QModelIndex *destParent,int dest)

{
  QModelIndex QVar1;
  QModelIndex childIdx;
  bool bVar2;
  bool bVar3;
  RootIndexProxyModelPrivate *pRVar4;
  RootIndexProxyModelPrivate *this_00;
  QPersistentModelIndex *this_01;
  QModelIndex local_90 [2];
  Data *local_60;
  Connection *pCStack_58;
  QAbstractItemModel *local_50;
  QPersistentModelIndex local_48;
  RootIndexProxyModel *pRStack_40;
  QAbstractItemModel *local_38;
  
  bVar2 = ignoreMove(this,sourceParent,destParent);
  if (!bVar2) {
    this_01 = &this->m_rootIndex;
    pRVar4 = (RootIndexProxyModelPrivate *)&stack0xffffffffffffffb8;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)pRVar4,this_01);
    QVar1.i = (quintptr)pRStack_40;
    QVar1._0_8_ = local_48.d;
    QVar1.m = local_38;
    bVar2 = isDescendant(pRVar4,QVar1,destParent);
    pRVar4 = (RootIndexProxyModelPrivate *)&local_60;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)pRVar4,this_01);
    childIdx.i = (quintptr)pCStack_58;
    childIdx._0_8_ = local_60;
    childIdx.m = local_50;
    bVar3 = isDescendant(pRVar4,childIdx,sourceParent);
    if (bVar2 == bVar3) {
      if (!bVar2) {
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_90,this_01);
        if ((((local_90[0].r != destParent->r) || (local_90[0].i != destParent->i)) ||
            (local_90[0].c != destParent->c)) || (local_90[0].m != destParent->m)) {
          QVar1 = *destParent;
          pRVar4 = (RootIndexProxyModelPrivate *)(local_90 + 1);
          this_00 = pRVar4;
          QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)pRVar4,this_01);
          bVar2 = isDescendant(this_00,QVar1,(QModelIndex *)pRVar4);
          if (!bVar2) {
            return;
          }
        }
        QAbstractItemModel::endMoveColumns();
      }
    }
    else if (bVar2) {
      QAbstractItemModel::endRemoveColumns();
    }
    else {
      QAbstractItemModel::endInsertColumns();
    }
  }
  return;
}

Assistant:

void RootIndexProxyModelPrivate::onColumnsMoved(const QModelIndex &sourceParent, int sourceStart, int sourceEnd, const QModelIndex &destParent,
                                                int dest)
{
    Q_UNUSED(sourceStart)
    Q_UNUSED(sourceEnd)
    Q_UNUSED(dest)
    Q_Q(RootIndexProxyModel);
    Q_ASSERT(!sourceParent.isValid() || sourceParent.model() == q->sourceModel());
    Q_ASSERT(!destParent.isValid() || destParent.model() == q->sourceModel());
    if (ignoreMove(sourceParent, destParent))
        return;
    const bool isDescendantRootDestParent = isDescendant(m_rootIndex, destParent);
    if (isDescendantRootDestParent == isDescendant(m_rootIndex, sourceParent)) {
        if (isDescendantRootDestParent)
            return;
        if (destParent != m_rootIndex && !isDescendant(destParent, m_rootIndex))
            return;
        q->endMoveColumns();
    } else if (isDescendantRootDestParent)
        q->endRemoveColumns();
    else
        q->endInsertColumns();
}